

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::piece_availability(torrent *this,vector<int,_piece_index_t> *avail)

{
  bool bVar1;
  pointer this_00;
  vector<int,_piece_index_t> *avail_local;
  torrent *this_local;
  
  bVar1 = has_picker(this);
  if (bVar1) {
    this_00 = ::std::
              unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
              ::operator->(&(this->super_torrent_hot_members).m_picker);
    piece_picker::get_availability(this_00,avail);
  }
  else {
    ::std::vector<int,_std::allocator<int>_>::clear(&avail->super_vector<int,_std::allocator<int>_>)
    ;
  }
  return;
}

Assistant:

void torrent::piece_availability(aux::vector<int, piece_index_t>& avail) const
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(valid_metadata());
		if (!has_picker())
		{
			avail.clear();
			return;
		}

		m_picker->get_availability(avail);
	}